

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * struct_union_enum_specifier
                  (dmr_C *C,type type,token *token,decl_state *ctx,
                  _func_token_ptr_dmr_C_ptr_token_ptr_symbol_ptr *parse)

{
  byte *pbVar1;
  token *ptVar2;
  uint uVar3;
  int iVar4;
  token *ptVar5;
  symbol *sym;
  char *pcVar6;
  char *fmt;
  position pVar7;
  
  ptVar5 = handle_attributes(C,token,ctx,8);
  pVar7 = ptVar5->pos;
  uVar3 = pVar7._0_4_ & 0x3f;
  if (uVar3 == 0x11) {
    if ((ptVar5->field_2).special == 0x7b) {
      sym = dmrC_alloc_symbol(C->S,pVar7,type);
      ptVar5 = (*parse)(C,ptVar5->next,sym);
      (ctx->ctype).base_type = sym;
      ptVar5 = dmrC_expect_token(C,ptVar5,0x7d,"at end of specifier");
LAB_0011a26b:
      sym->endpos = ptVar5->pos;
      return ptVar5;
    }
  }
  else if (uVar3 == 2) {
    sym = dmrC_lookup_symbol((ptVar5->field_2).ident,NS_STRUCT);
    if ((sym == (symbol *)0x0) ||
       (((iVar4 = dmrC_is_outer_scope(C,sym->scope), iVar4 != 0 &&
         (((ulong)ptVar5->next->pos & 0x3f) == 0x11)) &&
        (((ptVar5->next->field_2).special | 0x40) == 0x7b)))) {
      sym = dmrC_alloc_symbol(C->S,ptVar5->pos,type);
      dmrC_bind_symbol(C->S,sym,(ptVar5->field_2).ident,NS_STRUCT);
    }
    if (*(byte *)sym == type) {
      (ctx->ctype).base_type = sym;
      ptVar2 = ptVar5->next;
      if (((ulong)ptVar2->pos & 0x3f) != 0x11) {
        return ptVar2;
      }
      if ((ptVar2->field_2).special != 0x7b) {
        return ptVar2;
      }
      if ((sym->field_14).field_2.symbol_list == (symbol_list *)0x0) {
        sym->pos = ptVar5->pos;
        ptVar5 = (*parse)(C,ptVar2->next,sym);
        ptVar5 = dmrC_expect_token(C,ptVar5,0x7d,"at end of struct-union-enum-specifier");
        pbVar1 = (byte *)((long)&sym->field_14 + 0xe);
        *pbVar1 = *pbVar1 & 0xef;
        goto LAB_0011a26b;
      }
      pcVar6 = dmrC_show_typename(C,sym);
      pVar7 = ptVar2->pos;
      fmt = "redefinition of %s";
    }
    else {
      pcVar6 = dmrC_show_typename(C,sym);
      pVar7 = ptVar5->pos;
      fmt = "invalid tag applied to %s";
    }
    dmrC_error_die(C,pVar7,fmt,pcVar6);
  }
  dmrC_sparse_error(C,pVar7,"expected declaration");
  (ctx->ctype).base_type = &C->S->bad_ctype;
  return ptVar5;
}

Assistant:

static struct token *struct_union_enum_specifier(struct dmr_C *C, enum type type,
	struct token *token, struct decl_state *ctx,
	struct token *(*parse)(struct dmr_C *C, struct token *, struct symbol *))
{
	struct symbol *sym;
	struct position *repos;

	token = handle_attributes(C, token, ctx, KW_ATTRIBUTE);
	if (dmrC_token_type(token) == TOKEN_IDENT) {
		sym = dmrC_lookup_symbol(token->ident, NS_STRUCT);
		if (!sym ||
		    (dmrC_is_outer_scope(C, sym->scope) &&
		     (dmrC_match_op(token->next,';') || dmrC_match_op(token->next,'{')))) {
			// Either a new symbol, or else an out-of-scope
			// symbol being redefined.
			sym = dmrC_alloc_symbol(C->S, token->pos, type);
			dmrC_bind_symbol(C->S, sym, token->ident, NS_STRUCT);
		}
		if (sym->type != type)
			dmrC_error_die(C, token->pos, "invalid tag applied to %s", dmrC_show_typename (C, sym));
		ctx->ctype.base_type = sym;
		repos = &token->pos;
		token = token->next;
		if (dmrC_match_op(token, '{')) {
			// The following test is actually wrong for empty
			// structs, but (1) they are not C99, (2) gcc does
			// the same thing, and (3) it's easier.
			if (sym->symbol_list)
				dmrC_error_die(C, token->pos, "redefinition of %s", dmrC_show_typename (C, sym));
			sym->pos = *repos;
			token = parse(C, token->next, sym);
			token = dmrC_expect_token(C, token, '}', "at end of struct-union-enum-specifier");

			// Mark the structure as needing re-examination
			sym->examined = 0;
			sym->endpos = token->pos;
		}
		return token;
	}

	// private struct/union/enum type
	if (!dmrC_match_op(token, '{')) {
		dmrC_sparse_error(C, token->pos, "expected declaration");
		ctx->ctype.base_type = &C->S->bad_ctype;
		return token;
	}

	sym = dmrC_alloc_symbol(C->S, token->pos, type);
	token = parse(C, token->next, sym);
	ctx->ctype.base_type = sym;
	token =  dmrC_expect_token(C, token, '}', "at end of specifier");
	sym->endpos = token->pos;

	return token;
}